

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O2

TestStatus *
vkt::wsi::anon_unknown_0::createSurfaceTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  NativeObjects native;
  InstanceHelper instHelper;
  allocator<char> local_239;
  string local_238;
  RefBase<vk::Handle<(vk::HandleType)25>_> local_218;
  NativeObjects local_1f8;
  InstanceHelper local_1d8;
  
  InstanceHelper::InstanceHelper(&local_1d8,context,wsiType,(VkAllocationCallbacks *)0x0);
  local_218.m_data.object.m_internal = 0;
  NativeObjects::NativeObjects
            (&local_1f8,context,&local_1d8.supportedExtensions,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)&local_218);
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)&local_238,
             &local_1d8.vki.super_InstanceInterface,
             local_1d8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,wsiType,
             local_1f8.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             local_1f8.window.
             super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr,
             (VkAllocationCallbacks *)0x0);
  local_218.m_data.deleter.m_instance = (VkInstance)local_238.field_2._M_allocated_capacity;
  local_218.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_238.field_2._8_8_;
  local_218.m_data.object.m_internal = (deUint64)local_238._M_dataplus._M_p;
  local_218.m_data.deleter.m_instanceIface = (InstanceInterface *)local_238._M_string_length;
  local_238._M_dataplus._M_p = (pointer)0x0;
  local_238._M_string_length = 0;
  local_238.field_2._M_allocated_capacity = 0;
  local_238.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)25>_> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"Creating surface succeeded",&local_239);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase(&local_218);
  NativeObjects::~NativeObjects(&local_1f8);
  InstanceHelper::~InstanceHelper(&local_1d8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSurfaceTest (Context& context, Type wsiType)
{
	const InstanceHelper		instHelper	(context, wsiType);
	const NativeObjects			native		(context, instHelper.supportedExtensions, wsiType);
	const Unique<VkSurfaceKHR>	surface		(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));

	return tcu::TestStatus::pass("Creating surface succeeded");
}